

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacallhv_s(void *handle,char *name,void **args,size_t size)

{
  int iVar1;
  type_id tVar2;
  loader_data v;
  void *in_RDI;
  function f;
  value f_val;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  void *local_8;
  
  iVar1 = loader_impl_handle_validate(in_RDI);
  if (iVar1 == 0) {
    v = loader_handle_get(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    tVar2 = value_type_id(v);
    if (tVar2 == 0xd) {
      value_to_function(in_stack_ffffffffffffffc0);
    }
    local_8 = metacallfv_s(args,(void **)size,(size_t)f_val);
  }
  else {
    log_write_impl_va("metacall",0x21d,"metacallhv_s",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                      ,LOG_LEVEL_ERROR,"Handle %p passed to metacallhv_s is not valid",in_RDI);
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *metacallhv_s(void *handle, const char *name, void *args[], size_t size)
{
	if (loader_impl_handle_validate(handle) != 0)
	{
		// TODO: Implement type error return a value
		log_write("metacall", LOG_LEVEL_ERROR, "Handle %p passed to metacallhv_s is not valid", handle);
		return NULL;
	}

	value f_val = loader_handle_get(handle, name);
	function f = NULL;

	if (value_type_id(f_val) == TYPE_FUNCTION)
	{
		f = value_to_function(f_val);
	}

	return metacallfv_s(f, args, size);
}